

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int pmbtoken_pst1_get_h_for_testing(uint8_t *out)

{
  int iVar1;
  size_t sVar2;
  bool local_a9;
  undefined1 local_a8 [8];
  EC_AFFINE h;
  uint8_t *out_local;
  
  h.Y.words[8] = (BN_ULONG)out;
  iVar1 = pmbtoken_pst1_init_method();
  if (iVar1 == 0) {
    out_local._4_4_ = 0;
  }
  else {
    iVar1 = ec_jacobian_to_affine
                      (pmbtoken_pst1_method.group,(EC_AFFINE *)local_a8,&pmbtoken_pst1_method.h);
    local_a9 = false;
    if (iVar1 != 0) {
      sVar2 = ec_point_to_bytes(pmbtoken_pst1_method.group,(EC_AFFINE *)local_a8,
                                POINT_CONVERSION_UNCOMPRESSED,(uint8_t *)h.Y.words[8],0x61);
      local_a9 = sVar2 == 0x61;
    }
    out_local._4_4_ = (uint)local_a9;
  }
  return out_local._4_4_;
}

Assistant:

int pmbtoken_pst1_get_h_for_testing(uint8_t out[97]) {
  if (!pmbtoken_pst1_init_method()) {
    return 0;
  }
  EC_AFFINE h;
  return ec_jacobian_to_affine(pmbtoken_pst1_method.group, &h,
                               &pmbtoken_pst1_method.h) &&
         ec_point_to_bytes(pmbtoken_pst1_method.group, &h,
                           POINT_CONVERSION_UNCOMPRESSED, out, 97) == 97;
}